

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_timeouts_test.cpp
# Opt level: O3

void __thiscall sync_test::main(sync_test *this,string *param_1)

{
  ulong uVar1;
  int iVar2;
  undefined8 in_RAX;
  ulong uVar3;
  time_t tVar4;
  ostream *poVar5;
  time_t tVar6;
  char *pcVar7;
  value *v;
  long *plVar8;
  int *piVar9;
  ulong uVar10;
  bool bVar11;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  cppcms::application::response();
  uVar3 = cppcms::http::response::out();
  tVar4 = time((time_t *)0x0);
  poVar5 = std::ostream::_M_insert<unsigned_long>(uVar3);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(char *)((long)&uStack_38 + 7),1);
  bVar11 = true;
  if (((byte)poVar5[*(long *)(*(long *)poVar5 + -0x18) + 0x20] & 5) == 0) {
    uVar1 = 0;
    do {
      uVar10 = uVar1;
      if (uVar10 == 9999999) break;
      poVar5 = std::ostream::_M_insert<unsigned_long>(uVar3);
      uStack_38 = CONCAT17(10,(undefined7)uStack_38);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,(char *)((long)&uStack_38 + 7),1);
      uVar1 = uVar10 + 1;
    } while (((byte)poVar5[*(long *)(*(long *)poVar5 + -0x18) + 0x20] & 5) == 0);
    bVar11 = uVar10 < 9999999;
  }
  tVar6 = time((time_t *)0x0);
  pcVar7 = (char *)cppcms::application::settings();
  v = (value *)cppcms::json::value::at(pcVar7);
  iVar2 = cppcms::json::traits<int>::get(v);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"IO Completed in ",0x10);
  poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," seconds, timeout=",0x12);
  plVar8 = (long *)std::ostream::operator<<((ostream *)poVar5,iVar2);
  std::ios::widen((char)*(undefined8 *)(*plVar8 + -0x18) + (char)plVar8);
  std::ostream::put((char)plVar8);
  std::ostream::flush();
  if ((long)(iVar2 * 3) < tVar6 - tVar4) {
    piVar9 = &above_3to;
  }
  else {
    if ((long)(iVar2 * 2) <= tVar6 - tVar4) goto LAB_00108c18;
    piVar9 = &below_2to;
  }
  *piVar9 = *piVar9 + 1;
LAB_00108c18:
  if (bVar11) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Disconned as expected",0x15);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
    sync_bad_count = sync_bad_count + 1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Not disconnected!",0x11);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -8);
    std::ostream::put(-8);
    std::ostream::flush();
  }
  return;
}

Assistant:

virtual void main(std::string /*unused*/)
	{
		bool bad_found = false;
		std::ostream &out = response().out();
		time_t start = time(0);
		for(unsigned i=0;i<10000000;i++) {
			if(!(out << i << '\n')) {
				bad_found = true;
				break;
			}
		}
		time_t end = time(0);
		int timeout = settings().get<int>("http.timeout");
		std::cout << "IO Completed in " << (end-start) << " seconds, timeout=" << timeout << std::endl;
		if(end - start > 3*timeout)
			above_3to ++;
		else if(end - start < 2*timeout)
			below_2to ++;

		if(bad_found) {
			std::cout << "Disconned as expected" << std::endl;
			sync_bad_count++;
		}
		else {
			std::cout << "Not disconnected!" << std::endl;
		}
	}